

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionTypeParser.cpp
# Opt level: O2

InversionType * __thiscall
OpenMD::InversionTypeParser::parseLine(InversionTypeParser *this,string *line)

{
  uint uVar1;
  InversionTypeEnum IVar2;
  AmberImproperTorsionType *this_00;
  OpenMDException *pOVar3;
  int iVar4;
  RealType RVar6;
  RealType RVar7;
  vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
  parameters;
  ImproperCosineInversionParameter currParam;
  StringTokenizer tokenizer;
  ulong uVar5;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parameters," ;\t\n\r",(allocator<char> *)&currParam);
  StringTokenizer::StringTokenizer(&tokenizer,line,(string *)&parameters);
  std::__cxx11::string::~string((string *)&parameters);
  uVar1 = StringTokenizer::countTokens(&tokenizer);
  if ((int)uVar1 < 1) {
    pOVar3 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parameters,"InversionTypeParser: Not enough tokens",
               (allocator<char> *)&currParam);
    OpenMDException::OpenMDException(pOVar3,(string *)&parameters);
    __cxa_throw(pOVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_((string *)&parameters,&tokenizer);
  IVar2 = getInversionTypeEnum(this,(string *)&parameters);
  std::__cxx11::string::~string((string *)&parameters);
  if (IVar2 == itImproperCosine) {
    uVar5 = (ulong)(uVar1 - 1) / 3;
    if ((uVar1 < 4) || ((uVar1 - 1) % 3 != 0)) {
      pOVar3 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"InversionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar3,(string *)&parameters);
      __cxa_throw(pOVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    parameters.
    super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parameters.
    super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parameters.
    super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), iVar4 != 0) {
      currParam.kchi = StringTokenizer::nextTokenAsDouble(&tokenizer);
      currParam.n = StringTokenizer::nextTokenAsInt(&tokenizer);
      RVar6 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      currParam.delta = (RVar6 / 180.0) * 3.141592653589793;
      std::
      vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
      ::push_back(&parameters,&currParam);
    }
    this_00 = (AmberImproperTorsionType *)operator_new(0x38);
    ImproperCosineInversionType::ImproperCosineInversionType
              ((ImproperCosineInversionType *)this_00,&parameters);
    std::
    _Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
    ::~_Vector_base(&parameters.
                     super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                   );
  }
  else if (IVar2 == itHarmonic) {
    if (uVar1 < 3) {
      pOVar3 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"InversionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar3,(string *)&parameters);
      __cxa_throw(pOVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar6 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    RVar7 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (AmberImproperTorsionType *)operator_new(0x18);
    (this_00->super_PolynomialInversionType).super_InversionType._vptr_InversionType =
         (_func_int **)&PTR__InversionType_0027b098;
    *(double *)&(this_00->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl =
         RVar6 * 3282.806350011744;
    *(double *)
     &(this_00->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
      super__Rb_tree_header._M_header = RVar7 / 57.29577951308232;
  }
  else {
    if (IVar2 != itAmberImproper) {
      pOVar3 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"InversionTypeParser: Unknown Inversion Type",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar3,(string *)&parameters);
      __cxa_throw(pOVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    if (uVar1 == 1) {
      pOVar3 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"InversionTypeParser: Not enough tokens",
                 (allocator<char> *)&currParam);
      OpenMDException::OpenMDException(pOVar3,(string *)&parameters);
      __cxa_throw(pOVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar6 = StringTokenizer::nextTokenAsDouble(&tokenizer);
    this_00 = (AmberImproperTorsionType *)operator_new(0x40);
    AmberImproperTorsionType::AmberImproperTorsionType(this_00,RVar6);
  }
  StringTokenizer::~StringTokenizer(&tokenizer);
  return (InversionType *)this_00;
}

Assistant:

InversionType* InversionTypeParser::parseLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    InversionType* inversionType = NULL;

    int nTokens = tokenizer.countTokens();

    if (nTokens < 1) {
      throw OpenMDException("InversionTypeParser: Not enough tokens");
    }

    InversionTypeEnum it = getInversionTypeEnum(tokenizer.nextToken());

    nTokens -= 1;

    switch (it) {
    case itImproperCosine:

      if (nTokens < 3 || nTokens % 3 != 0) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {
        int nSets = nTokens / 3;

        std::vector<ImproperCosineInversionParameter> parameters;
        for (int i = 0; i < nSets; ++i) {
          ImproperCosineInversionParameter currParam;
          currParam.kchi  = tokenizer.nextTokenAsDouble();
          currParam.n     = tokenizer.nextTokenAsInt();
          currParam.delta = tokenizer.nextTokenAsDouble() / 180.0 *
                            Constants::PI;  // convert to rad
          parameters.push_back(currParam);
        }
        inversionType = new ImproperCosineInversionType(parameters);
      }

      break;

    case itAmberImproper:

      if (nTokens < 1) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {
        RealType v2   = tokenizer.nextTokenAsDouble();
        inversionType = new AmberImproperTorsionType(v2);
      }

      break;

    case itHarmonic:
      if (nTokens < 2) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {
        // Most inversion don't have specific angle information since
        // they are cosine polynomials.  This one is different,
        // however.  To match our other force field files
        // (particularly for bends):
        //
        // d0 should be read in kcal / mol / degrees^2
        // phi0 should be read in degrees

        RealType degreesPerRadian = 180.0 / Constants::PI;

        // convert to kcal / mol / radians^2
        RealType d0 = tokenizer.nextTokenAsDouble() * pow(degreesPerRadian, 2);

        // convert to radians
        RealType phi0 = tokenizer.nextTokenAsDouble() / degreesPerRadian;
        inversionType = new HarmonicInversionType(d0, phi0);
      }
      break;

      /*
    case itCentralAtomHeight :
      if (nTokens < 1) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {

        RealType k = tokenizer.nextTokenAsDouble();

        inversionType = new CentralAtomHeightInversionType(k);
      }
      break;
    case itDreiding :
      if (nTokens < 3) {
        throw OpenMDException("InversionTypeParser: Not enough tokens");
      } else {

        RealType k = tokenizer.nextTokenAsDouble();

        inversionType = new CentralAtomHeightInversionType(k);
      }
      break;
      */
    case itUnknown:
    default:
      throw OpenMDException("InversionTypeParser: Unknown Inversion Type");
    }
    return inversionType;
  }